

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int quicly_send(quicly_conn_t *conn,quicly_address_t *dest,quicly_address_t *src,iovec *datagrams,
               size_t *num_datagrams,void *buf,size_t bufsize)

{
  anon_struct_344_5_1a64b5c4_for_local *set;
  anon_struct_40_3_86e30b9a_for_stash *paVar1;
  uint64_t *puVar2;
  quicly_retire_cid_set_t *set_00;
  char cVar3;
  ushort uVar4;
  quicly_state_t qVar5;
  ptls_t *ppVar6;
  st_quicly_application_space_t *space;
  _func_void_void_ptr_char_ptr_varargs *p_Var7;
  void *pvVar8;
  st_quicly_stream_scheduler_t *psVar9;
  _func_int_st_quicly_stream_scheduler_t_ptr_quicly_conn_t_ptr_quicly_send_context_t_ptr *p_Var10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  byte bVar14;
  int iVar15;
  int64_t iVar16;
  st_quicly_pn_space_t *psVar17;
  uint64_t error_code;
  uint8_t *puVar18;
  quicly_stream_t *stream;
  uint uVar19;
  long lVar20;
  uint32_t uVar21;
  en_quicly_send_packet_mode_t mode;
  ulong uVar22;
  anon_union_24_13_c7673ae4_for_data *sent;
  _st_quicly_conn_public_t *c;
  char *pcVar23;
  long lVar24;
  st_quicly_pending_path_challenge_t *__ptr;
  quicly_address_t **buf_00;
  ulong uVar25;
  ulong uVar26;
  uint64_t uVar27;
  ulong uVar28;
  undefined1 auVar29 [8];
  size_t *psVar30;
  size_t num_sent;
  size_t sVar31;
  ulong uVar32;
  st_quicly_local_cid_t *new_cid;
  size_t sVar33;
  bool bVar34;
  undefined8 uStack_100;
  quicly_address_t *local_f8;
  quicly_address_t *local_f0;
  ulong local_e8;
  uint8_t *local_e0;
  undefined1 local_d8 [88];
  uint8_t *puStack_80;
  uint8_t *puStack_78;
  anon_struct_40_3_86e30b9a_for_stash *local_68;
  undefined1 local_60 [8];
  quicly_sentmap_iter_t iter;
  
  buf_00 = &local_f8;
  iVar15 = 0;
  local_d8._0_8_ = (st_quicly_cipher_context_t *)0x0;
  local_d8[8] = 0xff;
  local_d8._16_8_ = (st_quicly_cipher_context_t *)0x0;
  local_d8._24_8_ = (uint8_t *)0x0;
  local_d8._32_8_ = 0;
  uVar32 = *num_datagrams;
  local_d8._56_8_ = (st_quicly_sent_block_t *)0x0;
  local_d8._72_8_ = (long)buf + bufsize;
  register0x00001200 = ZEXT432(0) << 0x40;
  uStack_100 = 0x11ffec;
  local_f8 = src;
  local_f0 = dest;
  local_d8._40_8_ = datagrams;
  local_d8._48_8_ = uVar32;
  local_d8._64_8_ = buf;
  lock_now(conn,0);
  lVar24 = (conn->stash).now;
  uStack_100 = 0x11fffb;
  iVar16 = quicly_get_first_timeout(conn);
  if (lVar24 < iVar16) goto LAB_00120000;
  buf_00 = &local_f8;
  if (quicly_trace_fp != (FILE *)0x0) {
    uStack_100 = 0x120b1a;
    iVar15 = ptls_skip_tracing((conn->crypto).tls);
    buf_00 = &local_f8;
    if (iVar15 == 0) {
      iVar16 = (conn->stash).now;
      qVar5 = (conn->super).state;
      bVar14 = (conn->super).remote.cid_set.cids[0].cid.len;
      lVar24 = -(ulong)((uint)bVar14 * 2 + 0x10 & 0xfffffff0);
      buf_00 = (quicly_address_t **)((long)&local_f8 + lVar24);
      *(undefined8 *)((long)&uStack_100 + lVar24) = 0x120b63;
      pcVar23 = ptls_hexdump((char *)buf_00,&(conn->super).remote.cid_set.cids[0].cid,(ulong)bVar14)
      ;
      uVar19 = (conn->super).local.cid_set.plaintext.master_id;
      *(undefined8 *)((long)&uStack_100 + lVar24) = 0x120b96;
      fprintf((FILE *)quicly_trace_fp,
              "{\"type\":\"send\", \"conn\":%u, \"time\":%lld, \"state\":%lld, \"dcid\":\"%s\"}\n",
              (ulong)uVar19,iVar16,(long)(int)qVar5,pcVar23);
    }
  }
  if (QUICLY_STATE_CONNECTED < (conn->super).state) {
    iVar16 = (conn->stash).now;
    uVar4 = (conn->super).remote.transport_params.max_ack_delay;
    *(char *)((long)buf_00 + -8) = -0x4b;
    *(char *)((long)buf_00 + -7) = '\0';
    *(char *)((long)buf_00 + -6) = '\x12';
    *(char *)((long)buf_00 + -5) = '\0';
    *(char *)((long)buf_00 + -4) = '\0';
    *(char *)((long)buf_00 + -3) = '\0';
    *(char *)((long)buf_00 + -2) = '\0';
    *(char *)((long)buf_00 + -1) = '\0';
    quicly_loss_init_sentmap_iter
              (&(conn->egress).loss,(quicly_sentmap_iter_t *)local_60,iVar16,(uint)uVar4,1);
    qVar5 = (conn->super).state;
    if ((qVar5 == QUICLY_STATE_DRAINING) ||
       ((conn->super).stats.num_frames_sent.transport_close +
        (conn->super).stats.num_frames_sent.application_close != 0)) {
      if (*(quicly_sent_acked_cb *)local_60 != quicly_sentmap__type_packet) goto LAB_00120d99;
      if ((((anon_union_24_13_c7673ae4_for_data *)((long)local_60 + 8))->packet).packet_number ==
          0xffffffffffffffff) {
        iVar15 = 0xff03;
        if ((conn->super).local.uni.num_streams + (conn->super).local.bidi.num_streams +
            (conn->super).remote.bidi.num_streams + (conn->super).remote.uni.num_streams != 0) {
          *(char *)((long)buf_00 + -8) = -0x7c;
          *(char *)((long)buf_00 + -7) = '\x02';
          *(char *)((long)buf_00 + -6) = '\x12';
          *(char *)((long)buf_00 + -5) = '\0';
          *(char *)((long)buf_00 + -4) = '\0';
          *(char *)((long)buf_00 + -3) = '\0';
          *(char *)((long)buf_00 + -2) = '\0';
          *(char *)((long)buf_00 + -1) = '\0';
          __assert_fail("quicly_num_streams(conn) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                        ,0x1156,
                        "int quicly_send(quicly_conn_t *, quicly_address_t *, quicly_address_t *, struct iovec *, size_t *, void *, size_t)"
                       );
        }
        goto LAB_00120000;
      }
    }
    if ((qVar5 == QUICLY_STATE_CLOSING) && ((conn->egress).send_ack_at <= (conn->stash).now)) {
      iter.ref = (st_quicly_sent_block_t **)num_datagrams;
      *(char *)((long)buf_00 + -8) = -0x35;
      *(char *)((long)buf_00 + -7) = '\x03';
      *(char *)((long)buf_00 + -6) = '\x12';
      *(char *)((long)buf_00 + -5) = '\0';
      *(char *)((long)buf_00 + -4) = '\0';
      *(char *)((long)buf_00 + -3) = '\0';
      *(char *)((long)buf_00 + -2) = '\0';
      *(char *)((long)buf_00 + -1) = '\0';
      destroy_all_streams(conn,0,0);
      sVar31 = 0;
      do {
        *(char *)((long)buf_00 + -8) = -0x20;
        *(char *)((long)buf_00 + -7) = '\x03';
        *(char *)((long)buf_00 + -6) = '\x12';
        *(char *)((long)buf_00 + -5) = '\0';
        *(char *)((long)buf_00 + -4) = '\0';
        *(char *)((long)buf_00 + -3) = '\0';
        *(char *)((long)buf_00 + -2) = '\0';
        *(char *)((long)buf_00 + -1) = '\0';
        psVar17 = setup_send_space(conn,sVar31,(quicly_send_context_t *)local_d8);
        if (psVar17 != (st_quicly_pn_space_t *)0x0) {
          error_code = (uint64_t)(conn->egress).connection_close.error_code;
          uVar27 = (conn->egress).connection_close.frame_type;
          pcVar23 = (conn->egress).connection_close.reason_phrase;
          if (uVar27 == 0xffffffffffffffff) {
            if ((char)local_d8[8] < '\0') {
              bVar14 = local_d8[8] & 0xf0;
              if (bVar14 == 0xc0) {
                pcVar23 = "";
                uVar27 = 0;
                error_code = 0x2000c;
              }
              else {
                if (bVar14 == 0xd0) goto LAB_00120417;
                pcVar23 = "";
                uVar27 = 0;
                error_code = 0x2000c;
                if (bVar14 != 0xe0) {
                  *(char *)((long)buf_00 + -8) = -0x32;
                  *(char *)((long)buf_00 + -7) = '\x0e';
                  *(char *)((long)buf_00 + -6) = '\x12';
                  *(char *)((long)buf_00 + -5) = '\0';
                  *(char *)((long)buf_00 + -4) = '\0';
                  *(char *)((long)buf_00 + -3) = '\0';
                  *(char *)((long)buf_00 + -2) = '\0';
                  *(char *)((long)buf_00 + -1) = '\0';
                  __assert_fail("!\"FIXME\"",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                                ,0x224,"uint8_t get_epoch(uint8_t)");
                }
              }
            }
            else {
LAB_00120417:
              uVar27 = 0xffffffffffffffff;
            }
          }
          builtin_strncpy((char *)((long)buf_00 + -8),"1\x04\x12",4);
          *(char *)((long)buf_00 + -4) = '\0';
          *(char *)((long)buf_00 + -3) = '\0';
          *(char *)((long)buf_00 + -2) = '\0';
          *(char *)((long)buf_00 + -1) = '\0';
          puVar18 = quicly_encode_close_frame((uint8_t *)0x0,error_code,uVar27,pcVar23);
          builtin_strncpy((char *)((long)buf_00 + -8),"F\x04\x12",4);
          *(char *)((long)buf_00 + -4) = '\0';
          *(char *)((long)buf_00 + -3) = '\0';
          *(char *)((long)buf_00 + -2) = '\0';
          *(char *)((long)buf_00 + -1) = '\0';
          iVar15 = _do_allocate_frame(conn,(quicly_send_context_t *)local_d8,(size_t)puVar18,0);
          num_datagrams = (size_t *)iter.ref;
          if (iVar15 != 0) goto LAB_00120000;
          puVar18 = puStack_80;
          builtin_strncpy((char *)((long)buf_00 + -8),"`\x04\x12",4);
          *(char *)((long)buf_00 + -4) = '\0';
          *(char *)((long)buf_00 + -3) = '\0';
          *(char *)((long)buf_00 + -2) = '\0';
          *(char *)((long)buf_00 + -1) = '\0';
          puVar18 = quicly_encode_close_frame(puVar18,error_code,uVar27,pcVar23);
          puStack_80 = puVar18;
          if (uVar27 == 0xffffffffffffffff) {
            puVar2 = &(conn->super).stats.num_frames_sent.application_close;
            *puVar2 = *puVar2 + 1;
            if (quicly_trace_fp != (FILE *)0x0) {
              ppVar6 = (conn->crypto).tls;
              builtin_strncpy((char *)((long)buf_00 + -8),"I\x05\x12",4);
              *(char *)((long)buf_00 + -4) = '\0';
              *(char *)((long)buf_00 + -3) = '\0';
              *(char *)((long)buf_00 + -2) = '\0';
              *(char *)((long)buf_00 + -1) = '\0';
              iVar15 = ptls_skip_tracing(ppVar6);
              if (iVar15 == 0) {
                iVar16 = (conn->stash).now;
                uVar19 = (conn->super).local.cid_set.plaintext.master_id;
                builtin_strncpy((char *)((long)buf_00 + -8),"v\x05\x12",4);
                *(char *)((long)buf_00 + -4) = '\0';
                *(char *)((long)buf_00 + -3) = '\0';
                *(char *)((long)buf_00 + -2) = '\0';
                *(char *)((long)buf_00 + -1) = '\0';
                fprintf((FILE *)quicly_trace_fp,
                        "{\"type\":\"application-close-send\", \"conn\":%u, \"time\":%lld, \"error-code\":%llu, \"reason-phrase\":\"%s\"}\n"
                        ,(ulong)uVar19,iVar16,error_code,pcVar23);
              }
            }
          }
          else {
            puVar2 = &(conn->super).stats.num_frames_sent.transport_close;
            *puVar2 = *puVar2 + 1;
            if (quicly_trace_fp != (FILE *)0x0) {
              ppVar6 = (conn->crypto).tls;
              *(char *)((long)buf_00 + -8) = -0x72;
              *(char *)((long)buf_00 + -7) = '\x04';
              *(char *)((long)buf_00 + -6) = '\x12';
              *(char *)((long)buf_00 + -5) = '\0';
              *(char *)((long)buf_00 + -4) = '\0';
              *(char *)((long)buf_00 + -3) = '\0';
              *(char *)((long)buf_00 + -2) = '\0';
              *(char *)((long)buf_00 + -1) = '\0';
              iVar15 = ptls_skip_tracing(ppVar6);
              if (iVar15 == 0) {
                iVar16 = (conn->stash).now;
                uVar19 = (conn->super).local.cid_set.plaintext.master_id;
                *(char **)((long)buf_00 + -0x10) = pcVar23;
                *(char *)((long)buf_00 + -0x18) = -0x40;
                *(char *)((long)buf_00 + -0x17) = '\x04';
                *(char *)((long)buf_00 + -0x16) = '\x12';
                *(char *)((long)buf_00 + -0x15) = '\0';
                *(char *)((long)buf_00 + -0x14) = '\0';
                *(char *)((long)buf_00 + -0x13) = '\0';
                *(char *)((long)buf_00 + -0x12) = '\0';
                *(char *)((long)buf_00 + -0x11) = '\0';
                fprintf((FILE *)quicly_trace_fp,
                        "{\"type\":\"transport-close-send\", \"conn\":%u, \"time\":%lld, \"error-code\":%llu, \"frame-type\":%llu, \"reason-phrase\":\"%s\"}\n"
                        ,(ulong)uVar19,iVar16,error_code,uVar27);
              }
            }
          }
        }
        sVar31 = sVar31 + 1;
      } while (sVar31 != 4);
      builtin_strncpy((char *)((long)buf_00 + -8),"J\x06\x12",4);
      *(char *)((long)buf_00 + -4) = '\0';
      *(char *)((long)buf_00 + -3) = '\0';
      *(char *)((long)buf_00 + -2) = '\0';
      *(char *)((long)buf_00 + -1) = '\0';
      iVar15 = commit_send_packet(conn,(quicly_send_context_t *)local_d8,
                                  QUICLY_COMMIT_SEND_PACKET_MODE_SMALL);
      num_datagrams = (size_t *)iter.ref;
      if (iVar15 != 0) goto LAB_00120000;
    }
    if (*(quicly_sent_acked_cb *)local_60 != quicly_sentmap__type_packet) {
LAB_00120d99:
      *(char *)((long)buf_00 + -8) = -0x48;
      *(char *)((long)buf_00 + -7) = '\r';
      *(char *)((long)buf_00 + -6) = '\x12';
      *(char *)((long)buf_00 + -5) = '\0';
      *(char *)((long)buf_00 + -4) = '\0';
      *(char *)((long)buf_00 + -3) = '\0';
      *(char *)((long)buf_00 + -2) = '\0';
      *(char *)((long)buf_00 + -1) = '\0';
      __assert_fail("iter->p->acked == quicly_sentmap__type_packet",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                    ,0x13c,"const quicly_sent_packet_t *quicly_sentmap_get(quicly_sentmap_iter_t *)"
                   );
    }
    uVar21 = (conn->egress).loss.rtt.variance;
    if (uVar21 == 0) {
      uVar21 = ((conn->egress).loss.conf)->min_pto;
    }
    else {
      uVar21 = uVar21 << 2;
    }
    lVar20 = (ulong)(((uint)(conn->super).remote.transport_params.max_ack_delay +
                      (conn->egress).loss.rtt.smoothed + uVar21) * 4) +
             (((anon_union_24_13_c7673ae4_for_data *)((long)local_60 + 8))->packet).sent_at;
    (conn->egress).send_ack_at = lVar20;
    lVar24 = (conn->stash).now;
    iVar15 = 0;
    if (lVar20 <= lVar24) {
      (conn->egress).send_ack_at = lVar24 + 1;
    }
    goto LAB_00120000;
  }
  paVar1 = &conn->stash;
  iVar16 = (conn->stash).now;
  if ((conn->idle_timeout).at <= iVar16) {
    if (quicly_trace_fp != (FILE *)0x0) {
      *(char *)((long)buf_00 + -8) = -0x15;
      *(char *)((long)buf_00 + -7) = '\f';
      *(char *)((long)buf_00 + -6) = '\x12';
      *(char *)((long)buf_00 + -5) = '\0';
      *(char *)((long)buf_00 + -4) = '\0';
      *(char *)((long)buf_00 + -3) = '\0';
      *(char *)((long)buf_00 + -2) = '\0';
      *(char *)((long)buf_00 + -1) = '\0';
      quicly_send_cold_1();
    }
    (conn->super).state = QUICLY_STATE_DRAINING;
    *(char *)((long)buf_00 + -8) = -5;
    *(char *)((long)buf_00 + -7) = '\x01';
    *(char *)((long)buf_00 + -6) = '\x12';
    *(char *)((long)buf_00 + -5) = '\0';
    *(char *)((long)buf_00 + -4) = '\0';
    *(char *)((long)buf_00 + -3) = '\0';
    *(char *)((long)buf_00 + -2) = '\0';
    *(char *)((long)buf_00 + -1) = '\0';
    destroy_all_streams(conn,0,0);
    iVar15 = 0xff03;
    goto LAB_00120000;
  }
  bVar34 = true;
  uVar28 = 0;
  uVar19 = 0;
  local_68 = paVar1;
  if (iVar16 < (conn->egress).loss.alarm_at) {
LAB_00120170:
    uVar32 = 0xffffffffffffffff;
    if (((uint)(conn->super).remote.address_validation & 1) == 0) {
      uVar25 = (ulong)((conn->super).ctx)->pre_validation_amplification_limit *
               (conn->super).stats.num_bytes.received;
      puVar2 = &(conn->super).stats.num_bytes.sent;
      uVar32 = 0;
      if (*puVar2 <= uVar25) {
        uVar32 = uVar25 - *puVar2;
      }
    }
    uVar25 = (conn->egress).max_udp_payload_size * uVar28;
    if (bVar34) {
      uVar26 = (ulong)(conn->egress).cc.cwnd;
      psVar30 = &(conn->egress).loss.sentmap.bytes_in_flight;
      uVar22 = 0;
      if (*psVar30 <= uVar26) {
        uVar22 = uVar26 - *psVar30;
      }
      if (uVar25 < uVar22) {
        uVar25 = uVar22;
      }
    }
    if (uVar25 < uVar32) {
      uVar32 = uVar25;
    }
    local_d8._80_8_ = uVar32;
    bVar34 = uVar32 == 0;
    if (uVar28 == 0) {
      uVar19 = 0;
    }
    else {
      uVar19 = 1;
      if (((conn->super).local.bidi.next_stream_id & 1) == 0) {
        uVar19 = (uint)(conn->handshake == (st_quicly_handshake_space_t *)0x0);
      }
    }
    *(char *)((long)buf_00 + -8) = -0x2d;
    *(char *)((long)buf_00 + -7) = '\x05';
    *(char *)((long)buf_00 + -6) = '\x12';
    *(char *)((long)buf_00 + -5) = '\0';
    *(char *)((long)buf_00 + -4) = '\0';
    *(char *)((long)buf_00 + -3) = '\0';
    *(char *)((long)buf_00 + -2) = '\0';
    *(char *)((long)buf_00 + -1) = '\0';
    iVar15 = send_handshake_flow(conn,0,(quicly_send_context_t *)local_d8,(uint)bVar34,uVar19);
    if (iVar15 != 0) goto LAB_00120a4e;
    *(char *)((long)buf_00 + -8) = -4;
    *(char *)((long)buf_00 + -7) = '\x05';
    *(char *)((long)buf_00 + -6) = '\x12';
    *(char *)((long)buf_00 + -5) = '\0';
    *(char *)((long)buf_00 + -4) = '\0';
    *(char *)((long)buf_00 + -3) = '\0';
    *(char *)((long)buf_00 + -2) = '\0';
    *(char *)((long)buf_00 + -1) = '\0';
    iVar15 = send_handshake_flow(conn,2,(quicly_send_context_t *)local_d8,(uint)bVar34,
                                 (uint)(uVar28 != 0));
    if (iVar15 != 0) goto LAB_00120a4e;
    space = conn->application;
    local_e8 = uVar28;
    if ((space != (st_quicly_application_space_t *)0x0) &&
       ((space->cipher).egress.key.header_protection != (ptls_cipher_context_t *)0x0)) {
      local_d8._0_8_ = &(space->cipher).egress;
      if (space->one_rtt_writable == 0) {
        local_d8[8] = 0xd0;
      }
      else {
        local_d8[8] = 0x40;
        if (((conn->egress).send_ack_at <= (conn->stash).now) && ((space->super).unacked_count != 0)
           ) {
          *(char *)((long)buf_00 + -8) = -0x26;
          *(char *)((long)buf_00 + -7) = '\x06';
          *(char *)((long)buf_00 + -6) = '\x12';
          *(char *)((long)buf_00 + -5) = '\0';
          *(char *)((long)buf_00 + -4) = '\0';
          *(char *)((long)buf_00 + -3) = '\0';
          *(char *)((long)buf_00 + -2) = '\0';
          *(char *)((long)buf_00 + -1) = '\0';
          iVar15 = send_ack(conn,&space->super,(quicly_send_context_t *)local_d8);
          if (iVar15 != 0) goto LAB_00120a4e;
        }
      }
      iter.ref = (st_quicly_sent_block_t **)num_datagrams;
      if ((((conn->egress).datagram_frame_payloads.count != 0) &&
          (conn->application != (st_quicly_application_space_t *)0x0)) &&
         ((conn->application->cipher).egress.key.aead != (ptls_aead_context_t *)0x0)) {
        psVar30 = &(conn->egress).datagram_frame_payloads.payloads[0].len;
        sVar31 = 0;
        do {
          uVar28 = *psVar30;
          lVar24 = 2;
          if ((0x3f < uVar28) && (lVar24 = 3, 0x3fff < uVar28)) {
            lVar24 = (ulong)(0x3fffffff < uVar28) * 4 + 5;
          }
          *(char *)((long)buf_00 + -8) = -0x47;
          *(char *)((long)buf_00 + -7) = '\a';
          *(char *)((long)buf_00 + -6) = '\x12';
          *(char *)((long)buf_00 + -5) = '\0';
          *(char *)((long)buf_00 + -4) = '\0';
          *(char *)((long)buf_00 + -3) = '\0';
          *(char *)((long)buf_00 + -2) = '\0';
          *(char *)((long)buf_00 + -1) = '\0';
          iVar15 = _do_allocate_frame(conn,(quicly_send_context_t *)local_d8,lVar24 + uVar28,1);
          num_datagrams = (size_t *)iter.ref;
          if (iVar15 != 0) goto LAB_00120a4e;
          puVar18 = puStack_80;
          if ((ulong)((long)puStack_78 - (long)puStack_80) < lVar24 + uVar28) {
            puStack_80 = puStack_80 + 1;
            *puVar18 = '\0';
          }
          else {
            puVar18 = ((ptls_iovec_t *)(psVar30 + -1))->base;
            uVar28 = *psVar30;
            *puStack_80 = '1';
            auVar29 = (undefined1  [8])(puStack_80 + 1);
            if (0x3f < uVar28) {
              local_e0 = puVar18;
              if (uVar28 < 0x4000) {
                puStack_80[1] = (byte)(uVar28 >> 8) | 0x40;
                auVar29 = (undefined1  [8])(puStack_80 + 2);
              }
              else {
                *(char *)((long)buf_00 + -8) = -0x47;
                *(char *)((long)buf_00 + -7) = '\b';
                *(char *)((long)buf_00 + -6) = '\x12';
                *(char *)((long)buf_00 + -5) = '\0';
                *(char *)((long)buf_00 + -4) = '\0';
                *(char *)((long)buf_00 + -3) = '\0';
                *(char *)((long)buf_00 + -2) = '\0';
                *(char *)((long)buf_00 + -1) = '\0';
                quicly_send_cold_3();
                puVar18 = local_e0;
                auVar29 = local_60;
              }
            }
            *(char *)&((quicly_sent_t *)auVar29)->acked = (char)uVar28;
            builtin_strncpy((char *)((long)buf_00 + -8),"\x05\b\x12",4);
            *(char *)((long)buf_00 + -4) = '\0';
            *(char *)((long)buf_00 + -3) = '\0';
            *(char *)((long)buf_00 + -2) = '\0';
            *(char *)((long)buf_00 + -1) = '\0';
            memcpy((undefined1 *)((long)&((quicly_sent_t *)auVar29)->acked + 1),puVar18,uVar28);
            puStack_80 = (undefined1 *)((long)&((quicly_sent_t *)auVar29)->acked + uVar28 + 1);
            if (quicly_trace_fp != (FILE *)0x0) {
              ppVar6 = (conn->crypto).tls;
              builtin_strncpy((char *)((long)buf_00 + -8),"t\b\x12",4);
              *(char *)((long)buf_00 + -4) = '\0';
              *(char *)((long)buf_00 + -3) = '\0';
              *(char *)((long)buf_00 + -2) = '\0';
              *(char *)((long)buf_00 + -1) = '\0';
              iVar15 = ptls_skip_tracing(ppVar6);
              if (iVar15 == 0) {
                iVar16 = (conn->stash).now;
                puVar18 = ((ptls_iovec_t *)(psVar30 + -1))->base;
                uVar28 = *psVar30;
                uVar19 = (conn->super).local.cid_set.plaintext.master_id;
                *(char *)((long)buf_00 + -8) = -0x5b;
                *(char *)((long)buf_00 + -7) = '\b';
                *(char *)((long)buf_00 + -6) = '\x12';
                *(char *)((long)buf_00 + -5) = '\0';
                *(char *)((long)buf_00 + -4) = '\0';
                *(char *)((long)buf_00 + -3) = '\0';
                *(char *)((long)buf_00 + -2) = '\0';
                *(char *)((long)buf_00 + -1) = '\0';
                fprintf((FILE *)quicly_trace_fp,
                        "{\"type\":\"datagram-send\", \"conn\":%u, \"time\":%lld, \"payload\":\"0x%llx\", \"payload-len\":%llu}\n"
                        ,(ulong)uVar19,iVar16,puVar18,uVar28);
              }
            }
          }
          sVar31 = sVar31 + 1;
          psVar30 = psVar30 + 2;
        } while (sVar31 != (conn->egress).datagram_frame_payloads.count);
      }
      num_datagrams = (size_t *)iter.ref;
      if (uVar32 != 0) {
        if (local_e8 != 0) {
          *(char *)((long)buf_00 + -8) = -10;
          *(char *)((long)buf_00 + -7) = '\b';
          *(char *)((long)buf_00 + -6) = '\x12';
          *(char *)((long)buf_00 + -5) = '\0';
          *(char *)((long)buf_00 + -4) = '\0';
          *(char *)((long)buf_00 + -3) = '\0';
          *(char *)((long)buf_00 + -2) = '\0';
          *(char *)((long)buf_00 + -1) = '\0';
          iVar15 = _do_allocate_frame(conn,(quicly_send_context_t *)local_d8,1,1);
          if (iVar15 != 0) goto LAB_00120a47;
          puVar18 = puStack_80;
          puStack_80 = puStack_80 + 1;
          *puVar18 = '\x01';
          puVar2 = &(conn->super).stats.num_frames_sent.ping;
          *puVar2 = *puVar2 + 1;
          if (quicly_trace_fp != (FILE *)0x0) {
            *(char *)((long)buf_00 + -8) = -0x3c;
            *(char *)((long)buf_00 + -7) = '\r';
            *(char *)((long)buf_00 + -6) = '\x12';
            *(char *)((long)buf_00 + -5) = '\0';
            *(char *)((long)buf_00 + -4) = '\0';
            *(char *)((long)buf_00 + -3) = '\0';
            *(char *)((long)buf_00 + -2) = '\0';
            *(char *)((long)buf_00 + -1) = '\0';
            quicly_send_cold_4();
          }
        }
        if (conn->application->one_rtt_writable == 0) {
LAB_00120e33:
          builtin_strncpy((char *)((long)buf_00 + -8),"B\x0e\x12",4);
          *(char *)((long)buf_00 + -4) = '\0';
          *(char *)((long)buf_00 + -3) = '\0';
          *(char *)((long)buf_00 + -2) = '\0';
          *(char *)((long)buf_00 + -1) = '\0';
          iVar15 = send_stream_control_frames(conn,(quicly_send_context_t *)local_d8);
          bVar34 = false;
          if (iVar15 == 0) {
            psVar9 = ((conn->super).ctx)->stream_scheduler;
            p_Var10 = psVar9->do_send;
            builtin_strncpy((char *)((long)buf_00 + -8),"h\x0e\x12",4);
            *(char *)((long)buf_00 + -4) = '\0';
            *(char *)((long)buf_00 + -3) = '\0';
            *(char *)((long)buf_00 + -2) = '\0';
            *(char *)((long)buf_00 + -1) = '\0';
            iVar15 = (*p_Var10)(psVar9,conn,(quicly_send_context_t *)local_d8);
            if (iVar15 == 0) {
              builtin_strncpy((char *)((long)buf_00 + -8),"\x7f\x0e\x12",4);
              *(char *)((long)buf_00 + -4) = '\0';
              *(char *)((long)buf_00 + -3) = '\0';
              *(char *)((long)buf_00 + -2) = '\0';
              *(char *)((long)buf_00 + -1) = '\0';
              iVar15 = send_stream_control_frames(conn,(quicly_send_context_t *)local_d8);
            }
          }
        }
        else {
          bVar14 = (conn->egress).pending_flows;
          if ((bVar14 & 0x40) != 0) {
            builtin_strncpy((char *)((long)buf_00 + -8),"K\t\x12",4);
            *(char *)((long)buf_00 + -4) = '\0';
            *(char *)((long)buf_00 + -3) = '\0';
            *(char *)((long)buf_00 + -2) = '\0';
            *(char *)((long)buf_00 + -1) = '\0';
            iVar15 = send_handshake_done(conn,(quicly_send_context_t *)local_d8);
            if (iVar15 != 0) goto LAB_00120a47;
            bVar14 = (conn->egress).pending_flows;
          }
          if ((bVar14 & 8) != 0) {
            builtin_strncpy((char *)((long)buf_00 + -8),"l\t\x12",4);
            *(char *)((long)buf_00 + -4) = '\0';
            *(char *)((long)buf_00 + -3) = '\0';
            *(char *)((long)buf_00 + -2) = '\0';
            *(char *)((long)buf_00 + -1) = '\0';
            stream = quicly_get_stream(conn,-4);
            if (stream == (quicly_stream_t *)0x0) {
              *(code **)((long)buf_00 + -8) = commit_send_packet;
              __assert_fail("stream != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                            ,0x10c2,"int do_send(quicly_conn_t *, quicly_send_context_t *)");
            }
            *(char *)((long)buf_00 + -8) = -0x79;
            *(char *)((long)buf_00 + -7) = '\t';
            *(char *)((long)buf_00 + -6) = '\x12';
            *(char *)((long)buf_00 + -5) = '\0';
            *(char *)((long)buf_00 + -4) = '\0';
            *(char *)((long)buf_00 + -3) = '\0';
            *(char *)((long)buf_00 + -2) = '\0';
            *(char *)((long)buf_00 + -1) = '\0';
            iVar15 = quicly_send_stream(stream,(quicly_send_context_t *)local_d8);
            if (iVar15 != 0) goto LAB_00120623;
            *(char *)((long)buf_00 + -8) = -0x69;
            *(char *)((long)buf_00 + -7) = '\t';
            *(char *)((long)buf_00 + -6) = '\x12';
            *(char *)((long)buf_00 + -5) = '\0';
            *(char *)((long)buf_00 + -4) = '\0';
            *(char *)((long)buf_00 + -3) = '\0';
            *(char *)((long)buf_00 + -2) = '\0';
            *(char *)((long)buf_00 + -1) = '\0';
            resched_stream_data(stream);
          }
          __ptr = (conn->egress).path_challenge.head;
          if (__ptr != (st_quicly_pending_path_challenge_t *)0x0) {
            do {
              *(char *)((long)buf_00 + -8) = -0x32;
              *(char *)((long)buf_00 + -7) = '\t';
              *(char *)((long)buf_00 + -6) = '\x12';
              *(char *)((long)buf_00 + -5) = '\0';
              *(char *)((long)buf_00 + -4) = '\0';
              *(char *)((long)buf_00 + -3) = '\0';
              *(char *)((long)buf_00 + -2) = '\0';
              *(char *)((long)buf_00 + -1) = '\0';
              iVar15 = _do_allocate_frame(conn,(quicly_send_context_t *)local_d8,9,0);
              if (iVar15 != 0) goto LAB_00120a47;
              puVar18 = puStack_80;
              bVar14 = __ptr->is_response;
              *(char *)((long)buf_00 + -8) = -0x19;
              *(char *)((long)buf_00 + -7) = '\t';
              *(char *)((long)buf_00 + -6) = '\x12';
              *(char *)((long)buf_00 + -5) = '\0';
              *(char *)((long)buf_00 + -4) = '\0';
              *(char *)((long)buf_00 + -3) = '\0';
              *(char *)((long)buf_00 + -2) = '\0';
              *(char *)((long)buf_00 + -1) = '\0';
              puVar18 = quicly_encode_path_challenge_frame(puVar18,(uint)bVar14,__ptr->data);
              puStack_80 = puVar18;
              puVar2 = &(conn->super).stats.num_frames_sent.path_challenge +
                       (__ptr->is_response != '\0');
              *puVar2 = *puVar2 + 1;
              (conn->egress).path_challenge.head = __ptr->next;
              builtin_strncpy((char *)((long)buf_00 + -8),"\x0e\n\x12",4);
              *(char *)((long)buf_00 + -4) = '\0';
              *(char *)((long)buf_00 + -3) = '\0';
              *(char *)((long)buf_00 + -2) = '\0';
              *(char *)((long)buf_00 + -1) = '\0';
              free(__ptr);
              __ptr = (conn->egress).path_challenge.head;
            } while (__ptr != (st_quicly_pending_path_challenge_t *)0x0);
            (conn->egress).path_challenge.tail_ref = &(conn->egress).path_challenge.head;
          }
          builtin_strncpy((char *)((long)buf_00 + -8),"9\n\x12",4);
          *(char *)((long)buf_00 + -4) = '\0';
          *(char *)((long)buf_00 + -3) = '\0';
          *(char *)((long)buf_00 + -2) = '\0';
          *(char *)((long)buf_00 + -1) = '\0';
          iVar15 = send_max_streams(conn,1,(quicly_send_context_t *)local_d8);
          if (iVar15 == 0) {
            bVar34 = false;
            *(char *)((long)buf_00 + -8) = -0x42;
            *(char *)((long)buf_00 + -7) = '\v';
            *(char *)((long)buf_00 + -6) = '\x12';
            *(char *)((long)buf_00 + -5) = '\0';
            *(char *)((long)buf_00 + -4) = '\0';
            *(char *)((long)buf_00 + -3) = '\0';
            *(char *)((long)buf_00 + -2) = '\0';
            *(char *)((long)buf_00 + -1) = '\0';
            iVar15 = send_max_streams(conn,0,(quicly_send_context_t *)local_d8);
            if (iVar15 != 0) goto LAB_00120a4e;
            *(char *)((long)buf_00 + -8) = -0x32;
            *(char *)((long)buf_00 + -7) = '\v';
            *(char *)((long)buf_00 + -6) = '\x12';
            *(char *)((long)buf_00 + -5) = '\0';
            *(char *)((long)buf_00 + -4) = '\0';
            *(char *)((long)buf_00 + -3) = '\0';
            *(char *)((long)buf_00 + -2) = '\0';
            *(char *)((long)buf_00 + -1) = '\0';
            iVar15 = should_send_max_data(conn);
            if (iVar15 != 0) {
              *(char *)((long)buf_00 + -8) = -10;
              *(char *)((long)buf_00 + -7) = '\v';
              *(char *)((long)buf_00 + -6) = '\x12';
              *(char *)((long)buf_00 + -5) = '\0';
              *(char *)((long)buf_00 + -4) = '\0';
              *(char *)((long)buf_00 + -3) = '\0';
              *(char *)((long)buf_00 + -2) = '\0';
              *(char *)((long)buf_00 + -1) = '\0';
              iVar15 = allocate_ack_eliciting_frame
                                 (conn,(quicly_send_context_t *)local_d8,9,
                                  (quicly_sent_t **)local_60,on_ack_max_data);
              num_datagrams = (size_t *)iter.ref;
              if (iVar15 != 0) goto LAB_00120a47;
              uVar27 = (((conn->super).ctx)->transport_params).max_data +
                       (conn->ingress).max_data.bytes_consumed;
              puVar18 = puStack_80;
              builtin_strncpy((char *)((long)buf_00 + -8),"\x1c\f\x12",4);
              *(char *)((long)buf_00 + -4) = '\0';
              *(char *)((long)buf_00 + -3) = '\0';
              *(char *)((long)buf_00 + -2) = '\0';
              *(char *)((long)buf_00 + -1) = '\0';
              puVar18 = quicly_encode_max_data_frame(puVar18,uVar27);
              puStack_80 = puVar18;
              sent = (anon_union_24_13_c7673ae4_for_data *)((long)local_60 + 8);
              builtin_strncpy((char *)((long)buf_00 + -8),"7\f\x12",4);
              *(char *)((long)buf_00 + -4) = '\0';
              *(char *)((long)buf_00 + -3) = '\0';
              *(char *)((long)buf_00 + -2) = '\0';
              *(char *)((long)buf_00 + -1) = '\0';
              quicly_maxsender_record
                        (&(conn->ingress).max_data.sender,uVar27,
                         (quicly_maxsender_sent_t *)&sent->packet);
              puVar2 = &(conn->super).stats.num_frames_sent.max_data;
              *puVar2 = *puVar2 + 1;
              if (quicly_trace_fp != (FILE *)0x0) {
                *(char *)((long)buf_00 + -8) = -0x22;
                *(char *)((long)buf_00 + -7) = '\x0e';
                *(char *)((long)buf_00 + -6) = '\x12';
                *(char *)((long)buf_00 + -5) = '\0';
                *(char *)((long)buf_00 + -4) = '\0';
                *(char *)((long)buf_00 + -3) = '\0';
                *(char *)((long)buf_00 + -2) = '\0';
                *(char *)((long)buf_00 + -1) = '\0';
                quicly_send_cold_5();
              }
              p_Var7 = (conn->super).tracer.cb;
              if (p_Var7 != (_func_void_void_ptr_char_ptr_varargs *)0x0) {
                iVar16 = (conn->stash).now;
                pvVar8 = (conn->super).tracer.ctx;
                *(char *)((long)buf_00 + -8) = -0x80;
                *(char *)((long)buf_00 + -7) = '\f';
                *(char *)((long)buf_00 + -6) = '\x12';
                *(char *)((long)buf_00 + -5) = '\0';
                *(char *)((long)buf_00 + -4) = '\0';
                *(char *)((long)buf_00 + -3) = '\0';
                *(char *)((long)buf_00 + -2) = '\0';
                *(char *)((long)buf_00 + -1) = '\0';
                (*p_Var7)(pvVar8,"{\"type\":\"max-data-send\", \"time\":%lld, \"maximum\":%llu}\n",
                          iVar16,uVar27);
              }
            }
            if ((conn->egress).data_blocked == QUICLY_SENDER_STATE_SEND) {
              *(char *)((long)buf_00 + -8) = -99;
              *(char *)((long)buf_00 + -7) = '\f';
              *(char *)((long)buf_00 + -6) = '\x12';
              *(char *)((long)buf_00 + -5) = '\0';
              *(char *)((long)buf_00 + -4) = '\0';
              *(char *)((long)buf_00 + -3) = '\0';
              *(char *)((long)buf_00 + -2) = '\0';
              *(char *)((long)buf_00 + -1) = '\0';
              iVar15 = send_data_blocked(conn,(quicly_send_context_t *)local_d8);
              num_datagrams = (size_t *)iter.ref;
              if (iVar15 != 0) goto LAB_00120a47;
            }
            *(char *)((long)buf_00 + -8) = -0x4a;
            *(char *)((long)buf_00 + -7) = '\f';
            *(char *)((long)buf_00 + -6) = '\x12';
            *(char *)((long)buf_00 + -5) = '\0';
            *(char *)((long)buf_00 + -4) = '\0';
            *(char *)((long)buf_00 + -3) = '\0';
            *(char *)((long)buf_00 + -2) = '\0';
            *(char *)((long)buf_00 + -1) = '\0';
            iVar15 = send_streams_blocked(conn,1,(quicly_send_context_t *)local_d8);
            num_datagrams = (size_t *)iter.ref;
            if (iVar15 == 0) {
              *(char *)((long)buf_00 + -8) = -0x34;
              *(char *)((long)buf_00 + -7) = '\f';
              *(char *)((long)buf_00 + -6) = '\x12';
              *(char *)((long)buf_00 + -5) = '\0';
              *(char *)((long)buf_00 + -4) = '\0';
              *(char *)((long)buf_00 + -3) = '\0';
              *(char *)((long)buf_00 + -2) = '\0';
              *(char *)((long)buf_00 + -1) = '\0';
              iVar15 = send_streams_blocked(conn,0,(quicly_send_context_t *)local_d8);
              num_datagrams = (size_t *)iter.ref;
              if (iVar15 == 0) {
                bVar14 = (conn->egress).pending_flows;
                if ((bVar14 & 0x20) != 0) {
                  builtin_strncpy((char *)((long)buf_00 + -8),"\'\r\x12",4);
                  *(char *)((long)buf_00 + -4) = '\0';
                  *(char *)((long)buf_00 + -3) = '\0';
                  *(char *)((long)buf_00 + -2) = '\0';
                  *(char *)((long)buf_00 + -1) = '\0';
                  iVar15 = send_resumption_token(conn,(quicly_send_context_t *)local_d8);
                  num_datagrams = (size_t *)iter.ref;
                  if (iVar15 != 0) goto LAB_00120a47;
                  bVar14 = (conn->egress).pending_flows;
                }
                num_datagrams = (size_t *)iter.ref;
                if ((char)bVar14 < '\0') {
                  set = &(conn->super).local;
                  sVar31 = (conn->super).local.cid_set._size;
                  if (sVar31 == 0) {
                    sVar33 = 0;
                  }
                  else {
                    new_cid = (conn->super).local.cid_set.cids;
                    num_sent = 0;
                    do {
                      sVar33 = num_sent;
                      if (new_cid->state != QUICLY_LOCAL_CID_STATE_PENDING) break;
                      *(char *)((long)buf_00 + -8) = -0x80;
                      *(char *)((long)buf_00 + -7) = '\r';
                      *(char *)((long)buf_00 + -6) = '\x12';
                      *(char *)((long)buf_00 + -5) = '\0';
                      *(char *)((long)buf_00 + -4) = '\0';
                      *(char *)((long)buf_00 + -3) = '\0';
                      *(char *)((long)buf_00 + -2) = '\0';
                      *(char *)((long)buf_00 + -1) = '\0';
                      iVar15 = send_new_connection_id
                                         (conn,(quicly_send_context_t *)local_d8,new_cid);
                      if (iVar15 != 0) {
                        *(char *)((long)buf_00 + -8) = -0x5d;
                        *(char *)((long)buf_00 + -7) = '\x0e';
                        *(char *)((long)buf_00 + -6) = '\x12';
                        *(char *)((long)buf_00 + -5) = '\0';
                        *(char *)((long)buf_00 + -4) = '\0';
                        *(char *)((long)buf_00 + -3) = '\0';
                        *(char *)((long)buf_00 + -2) = '\0';
                        *(char *)((long)buf_00 + -1) = '\0';
                        quicly_local_cid_on_sent(&set->cid_set,num_sent);
                        goto LAB_00120ea3;
                      }
                      num_sent = num_sent + 1;
                      new_cid = new_cid + 1;
                      sVar33 = sVar31;
                    } while (sVar31 != num_sent);
                  }
                  *(char *)((long)buf_00 + -8) = -0x28;
                  *(char *)((long)buf_00 + -7) = '\r';
                  *(char *)((long)buf_00 + -6) = '\x12';
                  *(char *)((long)buf_00 + -5) = '\0';
                  *(char *)((long)buf_00 + -4) = '\0';
                  *(char *)((long)buf_00 + -3) = '\0';
                  *(char *)((long)buf_00 + -2) = '\0';
                  *(char *)((long)buf_00 + -1) = '\0';
                  quicly_local_cid_on_sent(&set->cid_set,sVar33);
                  set_00 = &(conn->egress).retire_cid;
                  sVar31 = (conn->egress).retire_cid._num_pending;
                  if (sVar31 != 0) {
                    sVar33 = 0;
LAB_00120df9:
                    uVar27 = (conn->egress).retire_cid.sequences[sVar33];
                    builtin_strncpy((char *)((long)buf_00 + -8),"\r\x0e\x12",4);
                    *(char *)((long)buf_00 + -4) = '\0';
                    *(char *)((long)buf_00 + -3) = '\0';
                    *(char *)((long)buf_00 + -2) = '\0';
                    *(char *)((long)buf_00 + -1) = '\0';
                    iVar15 = send_retire_connection_id
                                       (conn,(quicly_send_context_t *)local_d8,uVar27);
                    if (iVar15 == 0) goto code_r0x00120e11;
                    *(char *)((long)buf_00 + -8) = -0x6e;
                    *(char *)((long)buf_00 + -7) = '\x0e';
                    *(char *)((long)buf_00 + -6) = '\x12';
                    *(char *)((long)buf_00 + -5) = '\0';
                    *(char *)((long)buf_00 + -4) = '\0';
                    *(char *)((long)buf_00 + -3) = '\0';
                    *(char *)((long)buf_00 + -2) = '\0';
                    *(char *)((long)buf_00 + -1) = '\0';
                    quicly_retire_cid_shift(set_00,sVar33);
LAB_00120ea3:
                    bVar34 = false;
                    num_datagrams = (size_t *)iter.ref;
                    goto LAB_00120a4e;
                  }
LAB_00120e19:
                  builtin_strncpy((char *)((long)buf_00 + -8),"$\x0e\x12",4);
                  *(char *)((long)buf_00 + -4) = '\0';
                  *(char *)((long)buf_00 + -3) = '\0';
                  *(char *)((long)buf_00 + -2) = '\0';
                  *(char *)((long)buf_00 + -1) = '\0';
                  quicly_retire_cid_shift(set_00,sVar31);
                  puVar18 = &(conn->egress).pending_flows;
                  *puVar18 = *puVar18 & 0x7f;
                  num_datagrams = (size_t *)iter.ref;
                }
                goto LAB_00120e33;
              }
            }
          }
LAB_00120a47:
          bVar34 = false;
        }
        goto LAB_00120a4e;
      }
      bVar34 = true;
    }
  }
  else {
    if (conn->initial == (st_quicly_handshake_space_t *)0x0) {
      uVar19 = (uint)(conn->handshake == (st_quicly_handshake_space_t *)0x0);
    }
    uVar4 = (conn->super).remote.transport_params.max_ack_delay;
    (conn->egress).loss.alarm_at = 0x7fffffffffffffff;
    if ((conn->egress).loss.loss_time == 0x7fffffffffffffff) {
      bVar14 = (conn->egress).loss.pto_count;
      (conn->egress).loss.pto_count = bVar14 + 1;
      uVar28 = (ulong)(bVar14 < 0x7f) + 1;
      if (uVar32 < uVar28) {
LAB_001206f2:
        builtin_strncpy((char *)((long)buf_00 + -8),"\x11\a\x12",4);
        *(char *)((long)buf_00 + -4) = '\0';
        *(char *)((long)buf_00 + -3) = '\0';
        *(char *)((long)buf_00 + -2) = '\0';
        *(char *)((long)buf_00 + -1) = '\0';
        __assert_fail("min_packets_to_send <= s->max_datagrams",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0x106d,"int do_send(quicly_conn_t *, quicly_send_context_t *)");
      }
      if (quicly_trace_fp != (FILE *)0x0) {
        builtin_strncpy((char *)((long)buf_00 + -8),"\x04\r\x12",4);
        *(char *)((long)buf_00 + -4) = '\0';
        *(char *)((long)buf_00 + -3) = '\0';
        *(char *)((long)buf_00 + -2) = '\0';
        *(char *)((long)buf_00 + -1) = '\0';
        quicly_send_cold_2();
      }
      p_Var7 = (conn->super).tracer.cb;
      if (p_Var7 != (_func_void_void_ptr_char_ptr_varargs *)0x0) {
        cVar3 = (conn->egress).loss.pto_count;
        uVar19 = (conn->egress).cc.cwnd;
        pvVar8 = (conn->super).tracer.ctx;
        sVar31 = (conn->egress).loss.sentmap.bytes_in_flight;
        iVar16 = (conn->stash).now;
        builtin_strncpy((char *)((long)buf_00 + -8),"/\x03\x12",4);
        *(char *)((long)buf_00 + -4) = '\0';
        *(char *)((long)buf_00 + -3) = '\0';
        *(char *)((long)buf_00 + -2) = '\0';
        *(char *)((long)buf_00 + -1) = '\0';
        (*p_Var7)(pvVar8,
                  "{\"type\":\"pto\", \"time\":%lld, \"inflight\":%llu, \"cwnd\":%llu, \"pto-count\":%lld}\n"
                  ,iVar16,sVar31,(ulong)uVar19,(long)cVar3);
      }
      puVar2 = &(conn->super).stats.num_ptos;
      *puVar2 = *puVar2 + 1;
      local_60 = (undefined1  [8])((ulong)(conn->egress).max_udp_payload_size << (bVar14 < 0x7f));
      if (conn->initial == (st_quicly_handshake_space_t *)0x0) {
LAB_00120372:
        if (local_60 != (undefined1  [8])0x0) {
          if (conn->handshake != (st_quicly_handshake_space_t *)0x0) {
            *(char *)((long)buf_00 + -8) = -0x6e;
            *(char *)((long)buf_00 + -7) = '\x03';
            *(char *)((long)buf_00 + -6) = '\x12';
            *(char *)((long)buf_00 + -5) = '\0';
            *(char *)((long)buf_00 + -4) = '\0';
            *(char *)((long)buf_00 + -3) = '\0';
            *(char *)((long)buf_00 + -2) = '\0';
            *(char *)((long)buf_00 + -1) = '\0';
            iVar15 = mark_frames_on_pto(conn,'\x02',(size_t *)local_60);
            if (iVar15 != 0) goto LAB_00120a47;
            if (local_60 == (undefined1  [8])0x0) goto LAB_001203b1;
          }
          *(char *)((long)buf_00 + -8) = -0x57;
          *(char *)((long)buf_00 + -7) = '\x03';
          *(char *)((long)buf_00 + -6) = '\x12';
          *(char *)((long)buf_00 + -5) = '\0';
          *(char *)((long)buf_00 + -4) = '\0';
          *(char *)((long)buf_00 + -3) = '\0';
          *(char *)((long)buf_00 + -2) = '\0';
          *(char *)((long)buf_00 + -1) = '\0';
          iVar15 = scheduler_can_send(conn);
          if (iVar15 == 0) {
            builtin_strncpy((char *)((long)buf_00 + -8),"\"\a\x12",4);
            *(char *)((long)buf_00 + -4) = '\0';
            *(char *)((long)buf_00 + -3) = '\0';
            *(char *)((long)buf_00 + -2) = '\0';
            *(char *)((long)buf_00 + -1) = '\0';
            iVar15 = mark_frames_on_pto(conn,'\x03',(size_t *)local_60);
            if (iVar15 != 0) goto LAB_00120a47;
          }
        }
LAB_001203b1:
        bVar34 = false;
        goto LAB_00120170;
      }
      builtin_strncpy((char *)((long)buf_00 + -8),"f\x03\x12",4);
      *(char *)((long)buf_00 + -4) = '\0';
      *(char *)((long)buf_00 + -3) = '\0';
      *(char *)((long)buf_00 + -2) = '\0';
      *(char *)((long)buf_00 + -1) = '\0';
      iVar15 = mark_frames_on_pto(conn,'\0',(size_t *)local_60);
      if (iVar15 == 0) goto LAB_00120372;
      goto LAB_00120a47;
    }
    builtin_strncpy((char *)((long)buf_00 + -8),"\x1b\x06\x12",4);
    *(char *)((long)buf_00 + -4) = '\0';
    *(char *)((long)buf_00 + -3) = '\0';
    *(char *)((long)buf_00 + -2) = '\0';
    *(char *)((long)buf_00 + -1) = '\0';
    iVar15 = quicly_loss_detect_loss
                       (&(conn->egress).loss,iVar16,(uint)uVar4,uVar19,on_loss_detected);
    if (iVar15 == 0) {
      uVar28 = 1;
      if (uVar32 == 0) goto LAB_001206f2;
      goto LAB_00120170;
    }
LAB_00120623:
    bVar34 = false;
LAB_00120a4e:
    if ((iVar15 != 0xff02) && (iVar15 != 0)) goto LAB_00120000;
  }
  if ((uint8_t *)local_d8._24_8_ != (uint8_t *)0x0) {
    mode = QUICLY_COMMIT_SEND_PACKET_MODE_SMALL;
    if ((*(byte *)local_d8._64_8_ & 0xf0) == 0xc0) {
      mode = (en_quicly_send_packet_mode_t)(bVar34 & (byte)(conn->super).local.bidi.next_stream_id);
    }
    *(char *)((long)buf_00 + -8) = -0x67;
    *(char *)((long)buf_00 + -7) = '\n';
    *(char *)((long)buf_00 + -6) = '\x12';
    *(char *)((long)buf_00 + -5) = '\0';
    *(char *)((long)buf_00 + -4) = '\0';
    *(char *)((long)buf_00 + -3) = '\0';
    *(char *)((long)buf_00 + -2) = '\0';
    *(char *)((long)buf_00 + -1) = '\0';
    commit_send_packet(conn,(quicly_send_context_t *)local_d8,mode);
  }
  if ((conn->application == (st_quicly_application_space_t *)0x0) ||
     ((conn->application->super).unacked_count == 0)) {
    (conn->egress).send_ack_at = 0x7fffffffffffffff;
  }
  *(char *)((long)buf_00 + -8) = -0x37;
  *(char *)((long)buf_00 + -7) = '\n';
  *(char *)((long)buf_00 + -6) = '\x12';
  *(char *)((long)buf_00 + -5) = '\0';
  *(char *)((long)buf_00 + -4) = '\0';
  *(char *)((long)buf_00 + -3) = '\0';
  *(char *)((long)buf_00 + -2) = '\0';
  *(char *)((long)buf_00 + -1) = '\0';
  update_loss_alarm(conn,1);
  if ((st_quicly_sent_block_t *)local_d8._56_8_ != (st_quicly_sent_block_t *)0x0) {
    *(char *)((long)buf_00 + -8) = -0x23;
    *(char *)((long)buf_00 + -7) = '\n';
    *(char *)((long)buf_00 + -6) = '\x12';
    *(char *)((long)buf_00 + -5) = '\0';
    *(char *)((long)buf_00 + -4) = '\0';
    *(char *)((long)buf_00 + -3) = '\0';
    *(char *)((long)buf_00 + -2) = '\0';
    *(char *)((long)buf_00 + -1) = '\0';
    update_idle_timeout(conn,0);
  }
  *(char *)((long)buf_00 + -8) = -0x16;
  *(char *)((long)buf_00 + -7) = '\n';
  *(char *)((long)buf_00 + -6) = '\x12';
  *(char *)((long)buf_00 + -5) = '\0';
  *(char *)((long)buf_00 + -4) = '\0';
  *(char *)((long)buf_00 + -3) = '\0';
  *(char *)((long)buf_00 + -2) = '\0';
  *(char *)((long)buf_00 + -1) = '\0';
  assert_consistency(conn,1);
  iVar15 = 0;
LAB_00120000:
  *(undefined8 *)((long)buf_00 + -8) = 0x120008;
  clear_datagram_frame_payloads(conn);
  if ((st_quicly_sent_block_t *)local_d8._56_8_ != (st_quicly_sent_block_t *)0x0) {
    uVar11 = *(undefined8 *)&(conn->super).remote.address;
    uVar12 = *(undefined8 *)((long)&(conn->super).remote.address + 8);
    uVar13 = *(undefined8 *)((long)&(conn->super).remote.address + 0x14);
    *(undefined8 *)((local_f0->sa).sa_data + 10) =
         *(undefined8 *)((long)&(conn->super).remote.address + 0xc);
    *(undefined8 *)((long)&(local_f0->sin6).sin6_addr.__in6_u + 0xc) = uVar13;
    *(undefined8 *)local_f0 = uVar11;
    *(undefined8 *)((local_f0->sa).sa_data + 6) = uVar12;
    uVar11 = *(undefined8 *)&(conn->super).local.address;
    uVar12 = *(undefined8 *)((long)&(conn->super).local.address + 8);
    uVar13 = *(undefined8 *)((long)&(conn->super).local.address + 0x14);
    *(undefined8 *)((local_f8->sa).sa_data + 10) =
         *(undefined8 *)((long)&(conn->super).local.address + 0xc);
    *(undefined8 *)((long)&(local_f8->sin6).sin6_addr.__in6_u + 0xc) = uVar13;
    *(undefined8 *)local_f8 = uVar11;
    *(undefined8 *)((local_f8->sa).sa_data + 6) = uVar12;
  }
  *num_datagrams = local_d8._56_8_;
  *(undefined8 *)((long)buf_00 + -8) = 0x120060;
  unlock_now(conn);
  return iVar15;
code_r0x00120e11:
  sVar33 = sVar33 + 1;
  if (sVar31 == sVar33) goto LAB_00120e19;
  goto LAB_00120df9;
}

Assistant:

int quicly_send(quicly_conn_t *conn, quicly_address_t *dest, quicly_address_t *src, struct iovec *datagrams, size_t *num_datagrams,
                void *buf, size_t bufsize)
{
    quicly_send_context_t s = {{NULL, -1}, {}, datagrams, *num_datagrams, 0, {buf, (uint8_t *)buf + bufsize}};
    int ret;

    lock_now(conn, 0);

    /* bail out if there's nothing is scheduled to be sent */
    if (conn->stash.now < quicly_get_first_timeout(conn)) {
        ret = 0;
        goto Exit;
    }

    QUICLY_PROBE(SEND, conn, conn->stash.now, conn->super.state,
                 QUICLY_PROBE_HEXDUMP(conn->super.remote.cid_set.cids[0].cid.cid, conn->super.remote.cid_set.cids[0].cid.len));

    if (conn->super.state >= QUICLY_STATE_CLOSING) {
        quicly_sentmap_iter_t iter;
        init_acks_iter(conn, &iter);
        /* check if the connection can be closed now (after 3 pto) */
        if (conn->super.state == QUICLY_STATE_DRAINING ||
            conn->super.stats.num_frames_sent.transport_close + conn->super.stats.num_frames_sent.application_close != 0) {
            if (quicly_sentmap_get(&iter)->packet_number == UINT64_MAX) {
                assert(quicly_num_streams(conn) == 0);
                ret = QUICLY_ERROR_FREE_CONNECTION;
                goto Exit;
            }
        }
        if (conn->super.state == QUICLY_STATE_CLOSING && conn->egress.send_ack_at <= conn->stash.now) {
            /* destroy all streams; doing so is delayed until the emission of CONNECTION_CLOSE frame to allow quicly_close to be
             * called from a stream handler */
            destroy_all_streams(conn, 0, 0);
            /* send CONNECTION_CLOSE in all possible epochs */
            for (size_t epoch = 0; epoch < QUICLY_NUM_EPOCHS; ++epoch) {
                if ((ret = send_connection_close(conn, epoch, &s)) != 0)
                    goto Exit;
            }
            if ((ret = commit_send_packet(conn, &s, QUICLY_COMMIT_SEND_PACKET_MODE_SMALL)) != 0)
                goto Exit;
        }
        /* wait at least 1ms */
        if ((conn->egress.send_ack_at = quicly_sentmap_get(&iter)->sent_at + get_sentmap_expiration_time(conn)) <= conn->stash.now)
            conn->egress.send_ack_at = conn->stash.now + 1;
        ret = 0;
        goto Exit;
    }

    /* emit packets */
    if ((ret = do_send(conn, &s)) != 0)
        goto Exit;

    assert_consistency(conn, 1);

Exit:
    clear_datagram_frame_payloads(conn);
    if (s.num_datagrams != 0) {
        *dest = conn->super.remote.address;
        *src = conn->super.local.address;
    }
    *num_datagrams = s.num_datagrams;
    unlock_now(conn);
    return ret;
}